

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  bool bVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *message
  ;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *enum_type;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *service;
  FileOptions *options;
  FileDescriptorProto *containing_file;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  LocationRecorder location;
  
  containing_file = (FileDescriptorProto *)0x0;
  text._M_str = ";";
  text._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    text_00._M_str = "message";
    text_00._M_len = 7;
    bVar1 = LookingAt(this,text_00);
    if (bVar1) {
      LocationRecorder::LocationRecorder
                (&location,root_location,4,*(int *)((long)&file->field_0 + 0x28));
      this->recursion_depth_ = 0x20;
      message = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                          (&(file->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
      bVar2 = ParseMessageDefinition(this,message,&location,file);
    }
    else {
      text_01._M_str = "enum";
      text_01._M_len = 4;
      bVar1 = LookingAt(this,text_01);
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  (&location,root_location,5,*(int *)((long)&file->field_0 + 0x40));
        enum_type = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
        bVar2 = ParseEnumDefinition(this,enum_type,&location,file);
      }
      else {
        text_02._M_str = "service";
        text_02._M_len = 7;
        bVar1 = LookingAt(this,text_02);
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    (&location,root_location,6,*(int *)((long)&file->field_0 + 0x58));
          service = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (&(file->field_0)._impl_.service_.super_RepeatedPtrFieldBase);
          bVar2 = ParseServiceDefinition(this,service,&location,file);
        }
        else {
          text_03._M_str = "extend";
          text_03._M_len = 6;
          bVar1 = LookingAt(this,text_03);
          if (bVar1) {
            LocationRecorder::LocationRecorder(&location,root_location,7);
            bVar2 = ParseExtend(this,&(file->field_0)._impl_.extension_,
                                &(file->field_0)._impl_.message_type_,root_location,4,&location,file
                               );
          }
          else {
            text_04._M_str = "import";
            text_04._M_len = 6;
            bVar1 = LookingAt(this,text_04);
            if (bVar1) {
              bVar1 = ParseImport(this,&(file->field_0)._impl_.dependency_,
                                  &(file->field_0)._impl_.public_dependency_,
                                  &(file->field_0)._impl_.weak_dependency_,root_location,file);
              return bVar1;
            }
            text_05._M_str = "package";
            text_05._M_len = 7;
            bVar1 = LookingAt(this,text_05);
            if (bVar1) {
              bVar1 = ParsePackage(this,file,root_location,containing_file);
              return bVar1;
            }
            text_06._M_str = "option";
            text_06._M_len = 6;
            bVar1 = LookingAt(this,text_06);
            if (!bVar1) {
              RecordError(this,(ErrorMaker)ZEXT816(0x2fb188));
              return false;
            }
            LocationRecorder::LocationRecorder(&location,root_location,8);
            options = FileDescriptorProto::mutable_options(file);
            bVar2 = ParseOption(this,&options->super_Message,&location,file,OPTION_STATEMENT);
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kMessageTypeFieldNumber,
                              file->message_type_size());
    // Maximum depth allowed by the DescriptorPool.
    recursion_depth_ = internal::cpp::MaxMessageDeclarationNestingDepth();
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kEnumTypeFieldNumber,
                              file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kServiceFieldNumber,
                              file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(
        file->mutable_extension(), file->mutable_message_type(), root_location,
        FileDescriptorProto::kMessageTypeFieldNumber, location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(), root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    RecordError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}